

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int64_t __thiscall MovParsedSRTTrackData::getSttsVal(MovParsedSRTTrackData *this)

{
  pointer pMVar1;
  long lVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  ostringstream ss;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  ostringstream local_190 [376];
  
  if (this->sttsCnt == 0) {
    lVar2 = this->sttsPos + 1;
    this->sttsPos = lVar2;
    pMVar1 = (this->m_sc->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)((ulong)((long)(this->m_sc->stts_data).
                             super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar1) >> 4 & 0xffffffff) <=
        lVar2) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"MP4/MOV error: invalid stts index for SRT track #",0x31);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," at position ",0xd);
      std::ostream::_M_insert<long>((long)poVar3);
      puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar4 = 0x3b6;
      *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
      if (local_1b0 == &local_1a0) {
        puVar4[6] = local_1a0;
        puVar4[7] = uStack_19c;
        puVar4[8] = uStack_198;
        puVar4[9] = uStack_194;
      }
      else {
        *(uint **)(puVar4 + 2) = local_1b0;
        *(ulong *)(puVar4 + 6) = CONCAT44(uStack_19c,local_1a0);
      }
      *(undefined8 *)(puVar4 + 4) = local_1a8;
      local_1a0 = local_1a0 & 0xffffff00;
      __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    this->sttsCnt = (ulong)pMVar1[lVar2].count;
  }
  this->sttsCnt = this->sttsCnt + -1;
  return ((this->m_sc->stts_data).super__Vector_base<MOVStts,_std::allocator<MOVStts>_>._M_impl.
          super__Vector_impl_data._M_start[this->sttsPos].duration * 1000) /
         (long)(ulong)this->m_sc->time_scale;
}

Assistant:

int64_t getSttsVal()
    {
        if (sttsCnt == 0)
        {
            sttsPos++;
            if (sttsPos >= static_cast<unsigned>(m_sc->stts_data.size()))
                THROW(ERR_MOV_PARSE, "MP4/MOV error: invalid stts index for SRT track #"
                                         << m_sc->ffindex << " at position " << m_demuxer->getProcessedBytes())

            sttsCnt = m_sc->stts_data[sttsPos].count;
        }
        sttsCnt--;
        return m_sc->stts_data[sttsPos].duration * 1000 / m_sc->time_scale;
    }